

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deliminator.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Deliminator::Optimize
          (Deliminator *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  string *__src;
  LogicalComparisonJoin *delim_join;
  _func_int **pp_Var1;
  BaseStatistics *pBVar2;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  Expression *pEVar7;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  Expression *pEVar12;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  Expression *pEVar13;
  pointer *__ptr;
  pointer puVar14;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  iterator __begin1;
  pointer pDVar15;
  __normal_iterator<duckdb::JoinWithDelimGet_*,_std::vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>_>
  __i;
  Expression *pEVar16;
  vector<duckdb::DelimCandidate,_true> candidates;
  bool local_61;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_60;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_58;
  pointer local_50;
  vector<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_> local_48;
  
  (op->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (in_RDX->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00._M_head_impl = (Expression *)op;
  local_60 = in_RDX;
  local_58._M_head_impl = (LogicalOperator *)this;
  FindCandidates((Deliminator *)op,in_RDX,(vector<duckdb::DelimCandidate,_true> *)&local_48);
  local_50 = local_48.
             super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  pDVar15 = local_48.
            super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      delim_join = pDVar15->delim_join;
      pEVar12 = (Expression *)
                (pDVar15->joins).
                super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
                super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar13 = (Expression *)
                (pDVar15->joins).
                super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
                super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pEVar12 != pEVar13) {
        uVar11 = (long)pEVar13 - (long)pEVar12 >> 4;
        lVar6 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        ::std::
        __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::JoinWithDelimGet*,std::vector<duckdb::JoinWithDelimGet,std::allocator<duckdb::JoinWithDelimGet>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::Deliminator::Optimize(duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>)::__0>>
                  (pEVar12,pEVar13,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)pEVar13 - (long)pEVar12 < 0x101) {
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::JoinWithDelimGet*,std::vector<duckdb::JoinWithDelimGet,std::allocator<duckdb::JoinWithDelimGet>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::Deliminator::Optimize(duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>)::__0>>
                    (pEVar12,pEVar13);
          this_00._M_head_impl = pEVar12;
        }
        else {
          pEVar16 = (Expression *)&pEVar12[2].verification_stats;
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::JoinWithDelimGet*,std::vector<duckdb::JoinWithDelimGet,std::allocator<duckdb::JoinWithDelimGet>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::Deliminator::Optimize(duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>)::__0>>
                    (pEVar12,pEVar16);
          for (; this_00._M_head_impl = pEVar12, pEVar16 != pEVar13;
              pEVar16 = (Expression *)&(pEVar16->super_BaseExpression).alias) {
            pp_Var1 = (pEVar16->super_BaseExpression)._vptr_BaseExpression;
            pBVar2 = *(BaseStatistics **)&(pEVar16->super_BaseExpression).type;
            _Var3._M_head_impl =
                 pEVar16[-1].verification_stats.
                 super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                 .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
            pEVar7 = pEVar16;
            while (_Var3._M_head_impl < pBVar2) {
              _Var3._M_head_impl =
                   pEVar7[-1].verification_stats.
                   super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                   .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
              (pEVar7->super_BaseExpression)._vptr_BaseExpression =
                   (_func_int **)
                   pEVar7[-1].return_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
              *(BaseStatistics **)&(pEVar7->super_BaseExpression).type = _Var3._M_head_impl;
              _Var3._M_head_impl =
                   (BaseStatistics *)
                   pEVar7[-1].return_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              pEVar7 = (Expression *)
                       &pEVar7[-1].return_type.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
            }
            (pEVar7->super_BaseExpression)._vptr_BaseExpression = pp_Var1;
            *(BaseStatistics **)&(pEVar7->super_BaseExpression).type = pBVar2;
          }
        }
      }
      pEVar12 = (Expression *)
                (pDVar15->joins).
                super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
                super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pEVar12 ==
          (Expression *)
          (pDVar15->joins).
          super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
          super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        bVar9 = true;
        pEVar13 = pEVar12;
      }
      else {
        this_00._M_head_impl = (Expression *)op;
        bVar9 = HasSelection((Deliminator *)op,(LogicalOperator *)delim_join);
        pEVar13 = (Expression *)
                  (pDVar15->joins).
                  super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
                  super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pEVar12 = (Expression *)
                  (pDVar15->joins).
                  super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
                  super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pEVar16 = pEVar13;
        if (bVar9) {
          __src = &(pEVar13->super_BaseExpression).alias;
          if ((Expression *)__src != pEVar12) {
            memmove(pEVar13,__src,(long)pEVar12 - (long)__src);
            pEVar16 = (Expression *)
                      (pDVar15->joins).
                      super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                      .
                      super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar12 = (Expression *)
                      (pDVar15->joins).
                      super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                      .
                      super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            this_00._M_head_impl = pEVar13;
          }
          pEVar12 = (Expression *)
                    &pEVar12[-1].return_type.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          (pDVar15->joins).
          super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
          super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar12;
        }
        bVar9 = !bVar9;
        local_61 = true;
        pEVar13 = pEVar12;
        if (pEVar16 != pEVar12) {
          do {
            this_00._M_head_impl = (Expression *)op;
            bVar10 = RemoveJoinWithDelimGet
                               ((Deliminator *)op,delim_join,pDVar15->delim_get_count,
                                (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                 *)(pEVar16->super_BaseExpression)._vptr_BaseExpression,&local_61);
            bVar9 = (bool)(bVar9 & bVar10);
            pEVar16 = (Expression *)&(pEVar16->super_BaseExpression).alias;
          } while (pEVar16 != pEVar12);
          pEVar12 = (Expression *)
                    (pDVar15->joins).
                    super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                    .
                    super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pEVar13 = (Expression *)
                    (pDVar15->joins).
                    super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                    .
                    super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      if (((long)pEVar12 - (long)pEVar13 >> 4 == pDVar15->delim_get_count) && (bVar9 != false)) {
        (delim_join->super_LogicalJoin).super_LogicalOperator.type = LOGICAL_COMPARISON_JOIN;
        puVar4 = (delim_join->duplicate_eliminated_columns).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar5 = (delim_join->duplicate_eliminated_columns).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar14 = puVar4;
        if (puVar5 != puVar4) {
          do {
            this_00._M_head_impl =
                 (puVar14->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            if (this_00._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(this_00._M_head_impl)->super_BaseExpression + 8))();
            }
            (puVar14->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            puVar14 = puVar14 + 1;
          } while (puVar14 != puVar5);
          (delim_join->duplicate_eliminated_columns).
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar4;
        }
      }
      if ((delim_join->super_LogicalJoin).super_LogicalOperator.field_0x61 == '\b') {
        TrySwitchSingleToLeft((Deliminator *)this_00._M_head_impl,delim_join);
      }
      pDVar15 = pDVar15 + 1;
    } while (pDVar15 != local_50);
  }
  _Var8._M_head_impl = local_58._M_head_impl;
  *(LogicalOperator **)local_58._M_head_impl =
       (local_60->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (local_60->
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  ::std::vector<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>::~vector(&local_48)
  ;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )_Var8._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Deliminator::Optimize(unique_ptr<LogicalOperator> op) {
	root = op;

	vector<DelimCandidate> candidates;
	FindCandidates(op, candidates);

	if (candidates.empty()) {
		return op;
	}

	for (auto &candidate : candidates) {
		auto &delim_join = candidate.delim_join;

		// Sort these so the deepest are first
		std::sort(candidate.joins.begin(), candidate.joins.end(),
		          [](const JoinWithDelimGet &lhs, const JoinWithDelimGet &rhs) { return lhs.depth > rhs.depth; });

		bool all_removed = true;
		if (!candidate.joins.empty() && HasSelection(delim_join)) {
			// Keep the deepest join with DelimGet in these cases,
			// as the selection can greatly reduce the cost of the RHS child of the DelimJoin
			candidate.joins.erase(candidate.joins.begin());
			all_removed = false;
		}

		bool all_equality_conditions = true;
		for (auto &join : candidate.joins) {
			all_removed = RemoveJoinWithDelimGet(delim_join, candidate.delim_get_count, join.join.get(),
			                                     all_equality_conditions) &&
			              all_removed;
		}

		// Change type if there are no more duplicate-eliminated columns
		if (candidate.joins.size() == candidate.delim_get_count && all_removed) {
			delim_join.type = LogicalOperatorType::LOGICAL_COMPARISON_JOIN;
			delim_join.duplicate_eliminated_columns.clear();
		}

		// Only DelimJoins are ever created as SINGLE joins,
		// and we can switch from SINGLE to LEFT if the RHS is de-duplicated by an aggr
		if (delim_join.join_type == JoinType::SINGLE) {
			TrySwitchSingleToLeft(delim_join);
		}
	}

	return op;
}